

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_0::ProgramActiveUniformBlocksCase::test
          (ProgramActiveUniformBlocksCase *this)

{
  CallLogWrapper *this_00;
  int *piVar1;
  TestContext *pTVar2;
  int iVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLuint GVar6;
  StateQueryMemoryWriteGuard<int[2]> longlongUniformBlockUniformIndices;
  StateQueryMemoryWriteGuard<int> longlongUniformBlockUniforms;
  StateQueryMemoryWriteGuard<int[3]> uniformsBlockIndices;
  StateQueryMemoryWriteGuard<unsigned_int[3]> uniformIndices;
  char *uniformNames [3];
  char buffer [2048];
  StateQueryMemoryWriteGuard<int[2]> local_8f8;
  GLuint local_8d8;
  GLuint local_8d4;
  GLuint local_8d0;
  GLuint local_8cc;
  StateQueryMemoryWriteGuard<int> local_8c8;
  StateQueryMemoryWriteGuard<int[3]> local_8b8;
  StateQueryMemoryWriteGuard<unsigned_int[3]> local_888;
  char *local_858;
  char *pcStack_850;
  char *local_848;
  undefined1 local_838 [8];
  int local_830;
  TestLog local_828 [13];
  ios_base local_7c0 [1936];
  
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  GVar4 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  GVar5 = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  glu::CallLogWrapper::glShaderSource(this_00,GVar4,1,&test::testVertSource,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(this_00,GVar5,1,&test::testFragSource,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,GVar4);
  glu::CallLogWrapper::glCompileShader(this_00,GVar5);
  ApiCase::expectError(&this->super_ApiCase,0);
  GVar6 = glu::CallLogWrapper::glCreateProgram(this_00);
  glu::CallLogWrapper::glAttachShader(this_00,GVar6,GVar4);
  glu::CallLogWrapper::glAttachShader(this_00,GVar6,GVar5);
  glu::CallLogWrapper::glLinkProgram(this_00,GVar6);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    this_00,GVar4,0x8b81,1);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                    this_00,GVar5,0x8b81,1);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,GVar6,0x8b82,1);
  verifyProgramParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,GVar6,0x8a36,2);
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  local_838 = (undefined1  [8])local_828;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"longlongUniformBlockName","")
  ;
  verifyProgramParam(pTVar2,this_00,GVar6,0x8a35,local_830 + 1);
  local_8d4 = GVar5;
  local_8d0 = GVar4;
  if (local_838 != (undefined1  [8])local_828) {
    operator_delete((void *)local_838,(ulong)((long)&(local_828[0].m_log)->flags + 1));
  }
  ApiCase::expectError(&this->super_ApiCase,0);
  GVar4 = glu::CallLogWrapper::glGetUniformBlockIndex(this_00,GVar6,"longlongUniformBlockName");
  GVar5 = glu::CallLogWrapper::glGetUniformBlockIndex(this_00,GVar6,"shortUniformBlockName");
  local_848 = "shortUniformBlockName.vector4";
  local_858 = "longlongUniformBlockName.vector2";
  pcStack_850 = "shortUniformBlockName.vector2";
  local_888.m_postguard[2] = 0xdededede;
  local_888.m_value[1] = 0xdededede;
  local_888.m_value[2] = 0xdededede;
  local_888.m_postguard[0] = 0xdededede;
  local_888.m_postguard[1] = 0xdededede;
  local_888.m_preguard[0] = 0xdededede;
  local_888.m_preguard[1] = 0xdededede;
  local_888.m_preguard[2] = 0xdededede;
  local_888.m_value[0] = 0xdededede;
  local_8b8.m_postguard[2] = -0x21212122;
  local_8b8.m_value[1] = -0x21212122;
  local_8b8.m_value[2] = -0x21212122;
  local_8b8.m_postguard[0] = -0x21212122;
  local_8b8.m_postguard[1] = -0x21212122;
  local_8b8.m_preguard[0] = -0x21212122;
  local_8b8.m_preguard[1] = -0x21212122;
  local_8b8.m_preguard[2] = -0x21212122;
  local_8b8.m_value[0] = -0x21212122;
  glu::CallLogWrapper::glGetUniformIndices(this_00,GVar6,3,&local_858,local_888.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int[3]>::verifyValidity
            (&local_888,(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
            );
  ApiCase::expectError(&this->super_ApiCase,0);
  local_8cc = GVar6;
  glu::CallLogWrapper::glGetActiveUniformsiv
            (this_00,GVar6,3,local_888.m_value,0x8a3a,local_8b8.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[3]>::verifyValidity
            (&local_8b8,(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
            );
  ApiCase::expectError(&this->super_ApiCase,0);
  if (((local_8b8.m_value[0] != GVar4) || (local_8b8.m_value[1] != GVar5)) ||
     (local_8b8.m_value[2] != GVar5)) {
    local_838 = (undefined1  [8])
                ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
                m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_830);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_830,"// ERROR: Expected [",0x14);
    std::ostream::operator<<((ostringstream *)&local_830,GVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_830,", ",2);
    std::ostream::operator<<((ostringstream *)&local_830,GVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_830,", ",2);
    std::ostream::operator<<((ostringstream *)&local_830,GVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_830,"];",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_830,"got [",5);
    std::ostream::operator<<((ostringstream *)&local_830,local_8b8.m_value[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_830,", ",2);
    std::ostream::operator<<((ostringstream *)&local_830,local_8b8.m_value[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_830,", ",2);
    std::ostream::operator<<((ostringstream *)&local_830,local_8b8.m_value[2]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_830,"]",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_838,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_830);
    std::ios_base::~ios_base(local_7c0);
    pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"got wrong uniform block index");
    }
  }
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  local_838 = (undefined1  [8])local_828;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"longlongUniformBlockName","")
  ;
  GVar6 = local_8cc;
  verifyActiveUniformBlockParam(pTVar2,this_00,local_8cc,GVar4,0x8a41,local_830 + 1);
  if (local_838 != (undefined1  [8])local_828) {
    operator_delete((void *)local_838,(ulong)((long)&(local_828[0].m_log)->flags + 1));
  }
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  local_838 = (undefined1  [8])local_828;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"shortUniformBlockName","");
  verifyActiveUniformBlockParam(pTVar2,this_00,GVar6,GVar5,0x8a41,local_830 + 1);
  if (local_838 != (undefined1  [8])local_828) {
    operator_delete((void *)local_838,(ulong)((long)&(local_828[0].m_log)->flags + 1));
  }
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyActiveUniformBlockParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             GVar6,GVar4,0x8a44,1);
  verifyActiveUniformBlockParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             GVar6,GVar4,0x8a46,1);
  verifyActiveUniformBlockParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             GVar6,GVar5,0x8a44,1);
  verifyActiveUniformBlockParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             GVar6,GVar5,0x8a46,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyActiveUniformBlockParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             GVar6,GVar4,0x8a42,1);
  local_8d8 = GVar5;
  verifyActiveUniformBlockParam
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
             GVar6,GVar5,0x8a42,2);
  ApiCase::expectError(&this->super_ApiCase,0);
  local_8c8.m_preguard = -0x21212122;
  local_8c8.m_value = -0x21212122;
  local_8c8.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetActiveUniformBlockiv(this_00,GVar6,GVar4,0x8a42,&local_8c8.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
            (&local_8c8,(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
            );
  if (local_8c8.m_value == 2) {
    local_8f8.m_postguard[0] = -0x21212122;
    local_8f8.m_postguard[1] = -0x21212122;
    local_8f8.m_preguard[0] = -0x21212122;
    local_8f8.m_preguard[1] = -0x21212122;
    local_8f8.m_value[0] = -0x21212122;
    local_8f8.m_value[1] = -0x21212122;
    glu::CallLogWrapper::glGetActiveUniformBlockiv(this_00,GVar6,GVar4,0x8a43,local_8f8.m_value);
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::verifyValidity
              (&local_8f8,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    if (((local_8f8.m_value[0] != local_888.m_value[0]) ||
        (local_8f8.m_value[1] != local_888.m_value[1])) &&
       ((local_8f8.m_value[1] != local_888.m_value[0] ||
        (local_8f8.m_value[0] != local_888.m_value[1])))) {
      local_838 = (undefined1  [8])
                  ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
                  m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_830);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_830,"// ERROR: Expected {",0x14);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_830);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_830,", ",2);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_830);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_830,"};",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_830,"got {",5);
      std::ostream::operator<<((ostringstream *)&local_830,local_8f8.m_value[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_830,", ",2);
      std::ostream::operator<<((ostringstream *)&local_830,local_8f8.m_value[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_830,"}",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_838,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_830);
      std::ios_base::~ios_base(local_7c0);
      pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      if (pTVar2->m_testResult == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult(pTVar2,QP_TEST_RESULT_FAIL,"got wrong uniform indices");
      }
    }
  }
  memset(local_838,0,0x800);
  local_838[0] = 0x78;
  local_8c8._0_8_ = local_8c8._0_8_ & 0xffffffff00000000;
  glu::CallLogWrapper::glGetActiveUniformBlockName
            (this_00,GVar6,GVar4,0x800,&local_8c8.m_preguard,local_838);
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  iVar3 = local_8c8.m_preguard;
  piVar1 = local_8f8.m_postguard;
  local_8f8.m_preguard = (int  [2])piVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8f8,"longlongUniformBlockName","");
  checkIntEquals(pTVar2,iVar3,local_8f8.m_value[0]);
  if (local_8f8.m_preguard != (int  [2])piVar1) {
    operator_delete((void *)local_8f8.m_preguard,(long)local_8f8.m_postguard + 1);
  }
  local_8c8._0_8_ = local_8c8._0_8_ & 0xffffffff00000000;
  glu::CallLogWrapper::glGetActiveUniformBlockName
            (this_00,GVar6,local_8d8,0x800,&local_8c8.m_preguard,local_838);
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  iVar3 = local_8c8.m_preguard;
  local_8f8.m_preguard = (int  [2])piVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f8,"shortUniformBlockName","");
  checkIntEquals(pTVar2,iVar3,local_8f8.m_value[0]);
  GVar5 = local_8d4;
  if (local_8f8.m_preguard != (int  [2])piVar1) {
    operator_delete((void *)local_8f8.m_preguard,(long)local_8f8.m_postguard + 1);
  }
  local_8c8._0_8_ = local_8c8._0_8_ & 0xffffffff00000000;
  glu::CallLogWrapper::glGetActiveUniformBlockName
            (this_00,GVar6,GVar4,1,&local_8c8.m_preguard,local_838);
  checkIntEquals((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 local_8c8.m_preguard,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glDeleteShader(this_00,local_8d0);
  glu::CallLogWrapper::glDeleteShader(this_00,GVar5);
  glu::CallLogWrapper::glDeleteProgram(this_00,GVar6);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		static const char* testVertSource =
			"#version 300 es\n"
			"uniform longlongUniformBlockName {highp vec2 vector2;} longlongUniformInstanceName;\n"
			"uniform shortUniformBlockName {highp vec2 vector2;highp vec4 vector4;} shortUniformInstanceName;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = shortUniformInstanceName.vector4 + vec4(longlongUniformInstanceName.vector2.x) + vec4(shortUniformInstanceName.vector2.x);\n"
			"}\n\0";
		static const char* testFragSource =
			"#version 300 es\n"
			"uniform longlongUniformBlockName {highp vec2 vector2;} longlongUniformInstanceName;\n"
			"layout(location = 0) out mediump vec4 fragColor;"
			"void main (void)\n"
			"{\n"
			"	fragColor = vec4(longlongUniformInstanceName.vector2.y);\n"
			"}\n\0";

		GLuint shaderVert = glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag = glCreateShader(GL_FRAGMENT_SHADER);

		glShaderSource(shaderVert, 1, &testVertSource, DE_NULL);
		glShaderSource(shaderFrag, 1, &testFragSource, DE_NULL);

		glCompileShader(shaderVert);
		glCompileShader(shaderFrag);
		expectError(GL_NO_ERROR);

		GLuint program = glCreateProgram();
		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);
		glLinkProgram(program);
		expectError(GL_NO_ERROR);

		verifyShaderParam	(m_testCtx, *this, shaderVert,	GL_COMPILE_STATUS,	GL_TRUE);
		verifyShaderParam	(m_testCtx, *this, shaderFrag,	GL_COMPILE_STATUS,	GL_TRUE);
		verifyProgramParam	(m_testCtx, *this, program,		GL_LINK_STATUS,		GL_TRUE);

		verifyProgramParam	(m_testCtx, *this, program,		GL_ACTIVE_UNIFORM_BLOCKS, 2);
		verifyProgramParam	(m_testCtx, *this, program,		GL_ACTIVE_UNIFORM_BLOCK_MAX_NAME_LENGTH, (GLint)std::string("longlongUniformBlockName").length() + 1); // including a null terminator
		expectError(GL_NO_ERROR);

		GLint longlongUniformBlockIndex	= glGetUniformBlockIndex(program, "longlongUniformBlockName");
		GLint shortUniformBlockIndex	= glGetUniformBlockIndex(program, "shortUniformBlockName");

		const char* uniformNames[] =
		{
			"longlongUniformBlockName.vector2",
			"shortUniformBlockName.vector2",
			"shortUniformBlockName.vector4"
		};

		// test UNIFORM_BLOCK_INDEX

		DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(uniformNames) == 3);

		StateQueryMemoryWriteGuard<GLuint[DE_LENGTH_OF_ARRAY(uniformNames)]> uniformIndices;
		StateQueryMemoryWriteGuard<GLint[DE_LENGTH_OF_ARRAY(uniformNames)]> uniformsBlockIndices;

		glGetUniformIndices(program, DE_LENGTH_OF_ARRAY(uniformNames), uniformNames, uniformIndices);
		uniformIndices.verifyValidity(m_testCtx);
		expectError(GL_NO_ERROR);

		glGetActiveUniformsiv(program, DE_LENGTH_OF_ARRAY(uniformNames), uniformIndices, GL_UNIFORM_BLOCK_INDEX, uniformsBlockIndices);
		uniformsBlockIndices.verifyValidity(m_testCtx);
		expectError(GL_NO_ERROR);

		if (uniformsBlockIndices[0] != longlongUniformBlockIndex ||
			uniformsBlockIndices[1] != shortUniformBlockIndex ||
			uniformsBlockIndices[2] != shortUniformBlockIndex)
		{
			m_testCtx.getLog() << TestLog::Message
				<< "// ERROR: Expected ["	<< longlongUniformBlockIndex	<< ", " << shortUniformBlockIndex	<< ", " << shortUniformBlockIndex	<< "];"
				<<	"got ["					<< uniformsBlockIndices[0]		<< ", " << uniformsBlockIndices[1]	<< ", " << uniformsBlockIndices[2]	<< "]" << TestLog::EndMessage;
			if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong uniform block index");
		}

		// test UNIFORM_BLOCK_NAME_LENGTH

		verifyActiveUniformBlockParam(m_testCtx, *this, program, longlongUniformBlockIndex,	GL_UNIFORM_BLOCK_NAME_LENGTH, (GLint)std::string("longlongUniformBlockName").length() + 1); // including null-terminator
		verifyActiveUniformBlockParam(m_testCtx, *this, program, shortUniformBlockIndex,	GL_UNIFORM_BLOCK_NAME_LENGTH, (GLint)std::string("shortUniformBlockName").length() + 1); // including null-terminator
		expectError(GL_NO_ERROR);

		// test UNIFORM_BLOCK_REFERENCED_BY_VERTEX_SHADER & UNIFORM_BLOCK_REFERENCED_BY_FRAGMENT_SHADER

		verifyActiveUniformBlockParam(m_testCtx, *this, program, longlongUniformBlockIndex,	GL_UNIFORM_BLOCK_REFERENCED_BY_VERTEX_SHADER,	GL_TRUE);
		verifyActiveUniformBlockParam(m_testCtx, *this, program, longlongUniformBlockIndex,	GL_UNIFORM_BLOCK_REFERENCED_BY_FRAGMENT_SHADER,	GL_TRUE);
		verifyActiveUniformBlockParam(m_testCtx, *this, program, shortUniformBlockIndex,	GL_UNIFORM_BLOCK_REFERENCED_BY_VERTEX_SHADER,	GL_TRUE);
		verifyActiveUniformBlockParam(m_testCtx, *this, program, shortUniformBlockIndex,	GL_UNIFORM_BLOCK_REFERENCED_BY_FRAGMENT_SHADER,	GL_FALSE);
		expectError(GL_NO_ERROR);

		// test UNIFORM_BLOCK_ACTIVE_UNIFORMS

		verifyActiveUniformBlockParam(m_testCtx, *this, program, longlongUniformBlockIndex,	GL_UNIFORM_BLOCK_ACTIVE_UNIFORMS,	1);
		verifyActiveUniformBlockParam(m_testCtx, *this, program, shortUniformBlockIndex,	GL_UNIFORM_BLOCK_ACTIVE_UNIFORMS,	2);
		expectError(GL_NO_ERROR);

		// test UNIFORM_BLOCK_ACTIVE_UNIFORM_INDICES

		{
			StateQueryMemoryWriteGuard<GLint> longlongUniformBlockUniforms;
			glGetActiveUniformBlockiv(program, longlongUniformBlockIndex, GL_UNIFORM_BLOCK_ACTIVE_UNIFORMS, &longlongUniformBlockUniforms);
			longlongUniformBlockUniforms.verifyValidity(m_testCtx);

			if (longlongUniformBlockUniforms == 2)
			{
				StateQueryMemoryWriteGuard<GLint[2]> longlongUniformBlockUniformIndices;
				glGetActiveUniformBlockiv(program, longlongUniformBlockIndex, GL_UNIFORM_BLOCK_ACTIVE_UNIFORM_INDICES, longlongUniformBlockUniformIndices);
				longlongUniformBlockUniformIndices.verifyValidity(m_testCtx);

				if ((GLuint(longlongUniformBlockUniformIndices[0]) != uniformIndices[0] || GLuint(longlongUniformBlockUniformIndices[1]) != uniformIndices[1]) &&
					(GLuint(longlongUniformBlockUniformIndices[1]) != uniformIndices[0] || GLuint(longlongUniformBlockUniformIndices[0]) != uniformIndices[1]))
				{
					m_testCtx.getLog() << TestLog::Message
						<< "// ERROR: Expected {"	<< uniformIndices[0]						<< ", " << uniformIndices[1] << "};"
						<<	"got {"					<< longlongUniformBlockUniformIndices[0]	<< ", " << longlongUniformBlockUniformIndices[1] << "}" << TestLog::EndMessage;

					if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
						m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong uniform indices");
				}

			}
		}

		// check block names

		{
			char buffer[2048] = {'x'};
			GLint written = 0;
			glGetActiveUniformBlockName(program, longlongUniformBlockIndex, DE_LENGTH_OF_ARRAY(buffer), &written, buffer);
			checkIntEquals(m_testCtx, written, (GLint)std::string("longlongUniformBlockName").length());

			written = 0;
			glGetActiveUniformBlockName(program, shortUniformBlockIndex, DE_LENGTH_OF_ARRAY(buffer), &written, buffer);
			checkIntEquals(m_testCtx, written, (GLint)std::string("shortUniformBlockName").length());

			// and one with too small buffer
			written = 0;
			glGetActiveUniformBlockName(program, longlongUniformBlockIndex, 1, &written, buffer);
			checkIntEquals(m_testCtx, written, 0);
		}

		expectError(GL_NO_ERROR);
		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}